

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  TString *pTVar2;
  int iVar3;
  TString **ppTVar4;
  long lVar5;
  TString *pTVar6;
  uint uVar7;
  long lVar8;
  
  pgVar1 = L->l_G;
  iVar3 = (pgVar1->strt).size;
  lVar8 = (long)newsize;
  if (iVar3 < newsize) {
    ppTVar4 = (TString **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,lVar8 * 8);
    (pgVar1->strt).hash = ppTVar4;
    iVar3 = (pgVar1->strt).size;
    if (iVar3 < newsize) {
      lVar5 = (long)iVar3;
      do {
        (pgVar1->strt).hash[lVar5] = (TString *)0x0;
        lVar5 = lVar5 + 1;
      } while (lVar8 != lVar5);
    }
  }
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      ppTVar4 = (pgVar1->strt).hash;
      pTVar6 = ppTVar4[lVar5];
      ppTVar4[lVar5] = (TString *)0x0;
      if (pTVar6 != (TString *)0x0) {
        do {
          pTVar2 = (pTVar6->u).hnext;
          uVar7 = pTVar6->hash & newsize - 1U;
          pTVar6->u = *(anon_union_8_2_b887aad4_for_u *)((pgVar1->strt).hash + uVar7);
          (pgVar1->strt).hash[uVar7] = pTVar6;
          pTVar6 = pTVar2;
        } while (pTVar2 != (TString *)0x0);
        iVar3 = (pgVar1->strt).size;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  if (newsize < iVar3) {
    ppTVar4 = (TString **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,lVar8 << 3);
    (pgVar1->strt).hash = ppTVar4;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  if (newsize > tb->size) {  /* grow table if needed */
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
    for (i = tb->size; i < newsize; i++)
      tb->hash[i] = NULL;
  }
  for (i = 0; i < tb->size; i++) {  /* rehash */
    TString *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, newsize);  /* new position */
      p->u.hnext = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      p = hnext;
    }
  }
  if (newsize < tb->size) {  /* shrink table if needed */
    /* vanishing slice should be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
  }
  tb->size = newsize;
}